

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O3

Vec_Int_t * Gia_VtaFramesToAbs(Vec_Vec_t *vFrames)

{
  void *pvVar1;
  Vec_Int_t *p;
  int *piVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  iVar7 = vFrames->nSize;
  if ((long)iVar7 < 1) {
    iVar8 = 0;
  }
  else {
    lVar5 = 0;
    iVar8 = 0;
    do {
      iVar8 = iVar8 + *(int *)((long)vFrames->pArray[lVar5] + 4);
      lVar5 = lVar5 + 1;
    } while (iVar7 != lVar5);
  }
  p = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < (iVar7 + 2 + iVar8) - 1U) {
    iVar3 = iVar7 + 2 + iVar8;
  }
  p->nSize = 0;
  p->nCap = iVar3;
  if (iVar3 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar3 << 2);
  }
  p->pArray = piVar2;
  Vec_IntPush(p,iVar7);
  iVar7 = vFrames->nSize + 2;
  if (0 < vFrames->nSize) {
    lVar5 = 0;
    do {
      pvVar1 = vFrames->pArray[lVar5];
      Vec_IntPush(p,iVar7);
      iVar7 = iVar7 + *(int *)((long)pvVar1 + 4);
      lVar5 = lVar5 + 1;
    } while (lVar5 < vFrames->nSize);
  }
  Vec_IntPush(p,iVar7);
  uVar4 = p->nSize;
  iVar7 = vFrames->nSize;
  if (uVar4 != iVar7 + 2U) {
    __assert_fail("Vec_IntSize(vAbs) == Vec_VecSize(vFrames) + 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                  ,0xc1,"Vec_Int_t *Gia_VtaFramesToAbs(Vec_Vec_t *)");
  }
  if (0 < iVar7) {
    lVar5 = 0;
    do {
      pvVar1 = vFrames->pArray[lVar5];
      if (0 < *(int *)((long)pvVar1 + 4)) {
        lVar9 = 0;
        do {
          Vec_IntPush(p,*(int *)(*(long *)((long)pvVar1 + 8) + lVar9 * 4));
          lVar9 = lVar9 + 1;
        } while (lVar9 < *(int *)((long)pvVar1 + 4));
        iVar7 = vFrames->nSize;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar7);
    uVar4 = p->nSize;
  }
  if (0 < (int)uVar4) {
    iVar7 = *p->pArray;
    if ((-2 < iVar7) && (uVar6 = iVar7 + 1, uVar6 < uVar4)) {
      if (p->pArray[uVar6] != uVar4) {
        __assert_fail("Vec_IntEntry(vAbs, Vec_IntEntry(vAbs,0)+1) == Vec_IntSize(vAbs)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                      ,0xc5,"Vec_Int_t *Gia_VtaFramesToAbs(Vec_Vec_t *)");
      }
      return p;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Gia_VtaFramesToAbs( Vec_Vec_t * vFrames )
{
    Vec_Int_t * vOne, * vAbs;
    int i, k, Entry, nSize;
    vAbs = Vec_IntAlloc( 2 + Vec_VecSize(vFrames) + Vec_VecSizeSize(vFrames) );
    Vec_IntPush( vAbs, Vec_VecSize(vFrames) );
    nSize = Vec_VecSize(vFrames) + 2;
    Vec_VecForEachLevelInt( vFrames, vOne, i )
    {
        Vec_IntPush( vAbs, nSize );
        nSize += Vec_IntSize( vOne );
    }
    Vec_IntPush( vAbs, nSize );
    assert( Vec_IntSize(vAbs) == Vec_VecSize(vFrames) + 2 );
    Vec_VecForEachLevelInt( vFrames, vOne, i )
        Vec_IntForEachEntry( vOne, Entry, k )
            Vec_IntPush( vAbs, Entry );
    assert( Vec_IntEntry(vAbs, Vec_IntEntry(vAbs,0)+1) == Vec_IntSize(vAbs) );
    return vAbs;
}